

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::ImageDataParameter::MergePartialFromCodedStream
          (ImageDataParameter *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  string *psVar5;
  char *pcVar6;
  UnknownFieldSet *unknown_fields;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  ImageDataParameter *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_00794b9b:
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      google::protobuf::io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto switchD_00794db2_default;
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((tag_00 & 0xff) == 10) {
        psVar5 = mutable_source_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        source_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        source_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"caffe.ImageDataParameter.source");
        goto LAB_00794b9b;
      }
      break;
    case 2:
      if ((tag_00 & 0xff) != 0x15) break;
      set_has_scale(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,&this->scale_);
      goto joined_r0x007950dd;
    case 3:
      if ((tag_00 & 0xff) == 0x1a) {
        psVar5 = mutable_mean_file_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        mean_file_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        mean_file_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"caffe.ImageDataParameter.mean_file");
        goto LAB_00794b9b;
      }
      break;
    case 4:
      if ((tag_00 & 0xff) == 0x20) {
        set_has_batch_size(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (input,&this->batch_size_);
        goto joined_r0x007950dd;
      }
      break;
    case 5:
      if ((tag_00 & 0xff) == 0x28) {
        set_has_crop_size(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (input,&this->crop_size_);
        goto joined_r0x007950dd;
      }
      break;
    case 6:
      if ((tag_00 & 0xff) == 0x30) {
        set_has_mirror(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->mirror_);
        goto joined_r0x007950dd;
      }
      break;
    case 7:
      if ((tag_00 & 0xff) == 0x38) {
        set_has_rand_skip(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (input,&this->rand_skip_);
        goto joined_r0x007950dd;
      }
      break;
    case 8:
      if ((tag_00 & 0xff) == 0x40) {
        set_has_shuffle(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->shuffle_);
        goto joined_r0x007950dd;
      }
      break;
    case 9:
      if ((tag_00 & 0xff) == 0x48) {
        set_has_new_height(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (input,&this->new_height_);
        goto joined_r0x007950dd;
      }
      break;
    case 10:
      if ((tag_00 & 0xff) == 0x50) {
        set_has_new_width(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (input,&this->new_width_);
        goto joined_r0x007950dd;
      }
      break;
    case 0xb:
      if ((tag_00 & 0xff) == 0x58) {
        set_has_is_color(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->is_color_);
        goto joined_r0x007950dd;
      }
      break;
    case 0xc:
      if ((tag_00 & 0xff) == 0x62) {
        psVar5 = mutable_root_folder_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        root_folder_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        root_folder_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"caffe.ImageDataParameter.root_folder");
        goto LAB_00794b9b;
      }
    }
switchD_00794db2_default:
    if ((tag_00 == 0) ||
       (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
       WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar1 = google::protobuf::internal::WireFormat::SkipField(input,tag_00,unknown_fields);
joined_r0x007950dd:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool ImageDataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ImageDataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string source = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source().data(), this->source().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.source");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string mean_file = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_mean_file()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->mean_file().data(), this->mean_file().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.mean_file");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 batch_size = 4 [default = 1];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 crop_size = 5 [default = 0];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_crop_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &crop_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool mirror = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_mirror();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &mirror_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 rand_skip = 7 [default = 0];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_rand_skip();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &rand_skip_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool shuffle = 8 [default = false];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {
          set_has_shuffle();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &shuffle_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 new_height = 9 [default = 0];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_new_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &new_height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 new_width = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_new_width();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &new_width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool is_color = 11 [default = true];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          set_has_is_color();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &is_color_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string root_folder = 12 [default = ""];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_root_folder()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->root_folder().data(), this->root_folder().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.root_folder");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ImageDataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ImageDataParameter)
  return false;
#undef DO_
}